

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

int ImTextStrFromUtf8(ImWchar *buf,int buf_size,char *in_text,char *in_text_end,
                     char **in_text_remaining)

{
  uint uVar1;
  ImWchar *pIVar2;
  uint c;
  uint local_3c;
  char **local_38;
  
  pIVar2 = buf;
  local_38 = in_text_remaining;
  do {
    if (((buf + (long)buf_size + -1 <= pIVar2) ||
        (in_text_end != (char *)0x0 && in_text_end <= in_text)) || (*in_text == '\0')) break;
    uVar1 = ImTextCharFromUtf8(&local_3c,in_text,in_text_end);
    if (local_3c != 0) {
      *pIVar2 = (ImWchar)local_3c;
      pIVar2 = pIVar2 + 1;
    }
    in_text = in_text + uVar1;
  } while (local_3c != 0);
  *pIVar2 = 0;
  if (local_38 != (char **)0x0) {
    *local_38 = in_text;
  }
  return (int)((ulong)((long)pIVar2 - (long)buf) >> 1);
}

Assistant:

int ImTextStrFromUtf8(ImWchar* buf, int buf_size, const char* in_text, const char* in_text_end, const char** in_text_remaining)
{
    ImWchar* buf_out = buf;
    ImWchar* buf_end = buf + buf_size;
    while (buf_out < buf_end - 1 && (!in_text_end || in_text < in_text_end) && *in_text)
    {
        unsigned int c;
        in_text += ImTextCharFromUtf8(&c, in_text, in_text_end);
        if (c == 0)
            break;
        *buf_out++ = (ImWchar)c;
    }
    *buf_out = 0;
    if (in_text_remaining)
        *in_text_remaining = in_text;
    return (int)(buf_out - buf);
}